

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O3

DifferenceReport *
flow::diagnostics::difference
          (DifferenceReport *__return_storage_ptr__,BufferedReport *first,BufferedReport *second)

{
  pointer pMVar1;
  pointer pMVar2;
  bool bVar3;
  Message *m;
  pointer pMVar4;
  Message *m_1;
  pointer pMVar5;
  BufferedReport *__range2;
  
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar4 = (first->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (first->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pMVar4 == pMVar1) {
      pMVar4 = (second->messages_).
               super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar1 = (second->messages_).
               super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pMVar4 != pMVar1) {
        do {
          pMVar2 = (first->messages_).
                   super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pMVar5 = (first->messages_).
                        super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                        ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar2;
              pMVar5 = pMVar5 + 1) {
            bVar3 = Message::operator==(pMVar5,pMVar4);
            if (bVar3) goto LAB_001377f9;
          }
          std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
          push_back(&__return_storage_ptr__->second,pMVar4);
LAB_001377f9:
          pMVar4 = pMVar4 + 1;
        } while (pMVar4 != pMVar1);
      }
      return __return_storage_ptr__;
    }
    pMVar2 = (second->messages_).
             super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar5 = (second->messages_).
                  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                  ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar2; pMVar5 = pMVar5 + 1)
    {
      bVar3 = Message::operator==(pMVar5,pMVar4);
      if (bVar3) goto LAB_001377b1;
    }
    std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::push_back
              (&__return_storage_ptr__->first,pMVar4);
LAB_001377b1:
    pMVar4 = pMVar4 + 1;
  } while( true );
}

Assistant:

DifferenceReport difference(const BufferedReport& first, const BufferedReport& second) {
  DifferenceReport diff;

  for (const Message& m: first)
    if (!second.contains(m))
      diff.first.push_back(m);

  for (const Message& m: second)
    if (!first.contains(m))
      diff.second.push_back(m);

  return diff;
}